

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int binCollFunc(void *padFlag,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  
  iVar3 = nKey1 - nKey2;
  iVar2 = nKey2;
  if (nKey1 < nKey2) {
    iVar2 = nKey1;
  }
  __n = (size_t)iVar2;
  iVar1 = memcmp(pKey1,pKey2,__n);
  if ((((iVar1 == 0) && (iVar1 = iVar3, padFlag != (void *)0x0)) &&
      (iVar3 = allSpaces((char *)((long)pKey1 + __n),nKey1 - iVar2), iVar3 != 0)) &&
     (iVar2 = allSpaces((char *)((long)pKey2 + __n),nKey2 - iVar2), iVar2 != 0)) {
    return 0;
  }
  return iVar1;
}

Assistant:

static int binCollFunc(
  void *padFlag,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int rc, n;
  n = nKey1<nKey2 ? nKey1 : nKey2;
  /* EVIDENCE-OF: R-65033-28449 The built-in BINARY collation compares
  ** strings byte by byte using the memcmp() function from the standard C
  ** library. */
  assert( pKey1 && pKey2 );
  rc = memcmp(pKey1, pKey2, n);
  if( rc==0 ){
    if( padFlag
     && allSpaces(((char*)pKey1)+n, nKey1-n)
     && allSpaces(((char*)pKey2)+n, nKey2-n)
    ){
      /* EVIDENCE-OF: R-31624-24737 RTRIM is like BINARY except that extra
      ** spaces at the end of either string do not change the result. In other
      ** words, strings will compare equal to one another as long as they
      ** differ only in the number of spaces at the end.
      */
    }else{
      rc = nKey1 - nKey2;
    }
  }
  return rc;
}